

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_observer.hpp
# Opt level: O2

void __thiscall
afsm::test::test_fsm_observer::
state_changed<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::connection_fsm_def::transaction::idle,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::state<afsm::test::connection_fsm_def::transaction::exiting,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::test::events::commit>
          (test_fsm_observer *this,
          inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
          *param_1,state<afsm::test::connection_fsm_def::transaction::idle,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
                   *param_2,
          state<afsm::test::connection_fsm_def::transaction::exiting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
          *param_3,commit *param_4)

{
  ostream *poVar1;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  poVar1 = psst::operator<<((ostream *)&std::cerr,blue|bright);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0x11;
  poVar1 = std::operator<<(poVar1,0x2a);
  poVar1 = std::operator<<(poVar1,"*");
  poVar1 = psst::operator<<(poVar1,clear);
  poVar1 = std::operator<<(poVar1,0x20);
  poVar1 = std::operator<<(poVar1,": State changed ");
  psst::util::demangle<afsm::test::connection_fsm_def::transaction::idle>();
  get_name_components_after(&local_30,&local_50,&this->def_name);
  poVar1 = std::operator<<(poVar1,(string *)&local_30);
  poVar1 = std::operator<<(poVar1," -> ");
  psst::util::demangle<afsm::test::connection_fsm_def::transaction::exiting>();
  get_name_components_after(&local_70,&local_90,&this->def_name);
  poVar1 = std::operator<<(poVar1,(string *)&local_70);
  poVar1 = std::operator<<(poVar1," (");
  psst::util::demangle<afsm::test::events::commit>();
  get_name_components(&local_b0,&local_d0,1);
  poVar1 = std::operator<<(poVar1,(string *)&local_b0);
  std::operator<<(poVar1,")\n");
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void
    state_changed(FSM const&, SourceState const&, TargetState const&, Event const&) const noexcept
    {
        using ::psst::ansi_color;
        using ::psst::util::demangle;
        ::std::cerr
             << (ansi_color::blue | ansi_color::bright)
             << ::std::setw(event_name_width) << ::std::setfill('*')
             << "*" << ansi_color::clear  << ::std::setfill(' ')
             << ": State changed "
             << get_name_components_after(
                     demangle< typename SourceState::state_definition_type >(),
                     def_name)
             << " -> "
             << get_name_components_after(
                     demangle< typename TargetState::state_definition_type >(),
                     def_name)
             << " (" << get_name_components(demangle<Event>(), 1) << ")\n";
    }